

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

uint * SoapySDRDevice_readRegisters(SoapySDRDevice *device,char *name,uint addr,size_t *length)

{
  size_t sVar1;
  uint *__dest;
  allocator local_71;
  void *local_70;
  long local_68;
  undefined1 *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  sVar1 = *length;
  *length = 0;
  local_58 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *local_58 = 0;
  *(undefined4 *)(local_58 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_50,name,&local_71);
  (**(code **)(*(long *)device + 0x318))(&local_70,device,local_50,addr,sVar1);
  __dest = callocArrayType<unsigned_int>(local_68 - (long)local_70 >> 2);
  if (local_68 - (long)local_70 != 0) {
    memmove(__dest,local_70,local_68 - (long)local_70);
  }
  *length = local_68 - (long)local_70 >> 2;
  if (local_70 != (void *)0x0) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return __dest;
}

Assistant:

__SOAPY_SDR_C_CATCH
}

unsigned *SoapySDRDevice_readRegisters(const SoapySDRDevice *device, const char *name, const unsigned addr, size_t *length)
{
    const size_t inputLen = *length;
    *length = 0; //clear in case of error

    __SOAPY_SDR_C_TRY
    return toNumericList(device->readRegisters(name, addr, inputLen), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}